

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Function *f)

{
  bool bVar1;
  Expression *pEVar2;
  pool_ref *this_00;
  VariableDeclaration *pVVar3;
  pool_ref<soul::AST::VariableDeclaration> *v;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2;
  Function *f_local;
  ASTVisitor *this_local;
  
  pEVar2 = pool_ptr<soul::AST::Expression>::operator*(&f->returnType);
  (*this->_vptr_ASTVisitor[3])(this,pEVar2);
  __end2 = std::
           vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ::begin(&f->parameters);
  v = (pool_ref<soul::AST::VariableDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ::end(&f->parameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                                *)&v);
    if (!bVar1) break;
    this_00 = (pool_ref *)
              __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
              ::operator*(&__end2);
    pVVar3 = pool_ref::operator_cast_to_VariableDeclaration_(this_00);
    (*this->_vptr_ASTVisitor[4])(this,pVVar3);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Block>>(this,&f->block);
  return;
}

Assistant:

virtual void visit (AST::Function& f)
    {
        visitObject (*f.returnType);

        for (auto& v : f.parameters)
            visitObject (v);

        visitObjectIfNotNull (f.block);
    }